

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

bool Assimp::IFC::TryAddOpenings_Poly2Tri
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                *openings,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors,
               TempMesh *curmesh)

{
  pointer *this;
  pointer *this_00;
  pointer *this_01;
  Triangle *this_02;
  reference this_03;
  pointer this_04;
  bool bVar1;
  aiMatrix3x3t<double> *paVar2;
  size_type sVar3;
  reference pTVar4;
  const_reference v2;
  element_type *this_05;
  reference pVector;
  iterator iVar5;
  iterator iVar6;
  CDT *this_06;
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  *this_07;
  reference this_08;
  reference ppTVar7;
  Point *pPVar8;
  iterator __first;
  iterator __last;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  aiVector2t<double> aVar13;
  double *local_cb8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c60;
  const_iterator local_c58;
  aiVector3t<double> *local_c50;
  aiVector3t<double> *local_c48;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_c40;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_c38;
  const_iterator local_c30;
  value_type_conflict4 local_c24;
  aiVector3t<double> local_c20;
  undefined1 local_c08 [8];
  IfcVector3 v3;
  IfcVector2 v;
  int i;
  Triangle *tri;
  const_iterator __end3_5;
  const_iterator __begin3_5;
  vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *__range3_5;
  vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> tris;
  exception *e_1;
  reference local_9b0;
  IntPoint *point_1;
  iterator __end4;
  iterator __begin4;
  Polygon *__range4;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *contour_1;
  pointer ppPStack_980;
  pointer local_978;
  reference local_970;
  Polygon *opening;
  iterator __end3_4;
  iterator __begin3_4;
  Polygons *__range3_4;
  exception *e;
  CDT *cdt;
  reference local_758;
  IntPoint *point;
  iterator __end3_3;
  iterator __begin3_3;
  Polygon *__range3_3;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> contour_points;
  ExPolygon *clip;
  iterator __end2_2;
  iterator __begin2_2;
  ExPolygons *__range2_2;
  vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
  contours;
  vector<unsigned_int,_std::allocator<unsigned_int>_> old_vertcnt;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> old_verts;
  char *sx;
  IntPoint local_4c0;
  reference local_4b0;
  IfcVector2 *pip_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range3_2;
  Polygon poly;
  IntPoint local_460;
  reference local_450;
  IfcVector2 *pip;
  iterator __end3_1;
  iterator __begin3_1;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range3_1;
  Polygon hole;
  aiVector3t<double> local_408;
  byte local_3e9;
  undefined1 local_3e8 [7];
  bool is_extruded_side;
  undefined1 auStack_3d0 [8];
  IfcVector3 vv_extr;
  IfcVector3 vv_1;
  IfcVector3 *xx;
  iterator __end3;
  iterator __begin3;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range3;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *va;
  IfcFloat dot;
  IfcVector3 *outernor;
  TempOpening *t;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *__range2_1;
  size_t c;
  Clipper clipper_holes;
  undefined1 auStack_260 [7];
  bool first;
  IfcVector3 wall_extrusion;
  Polygons holes_union;
  ExPolygons clipped;
  aiVector2t<double> local_208;
  aiVector2t<double> local_1f8;
  aiVector2t<double> local_1e8;
  aiVector2t<double> local_1d8;
  undefined1 local_1c8 [8];
  IfcVector3 vv;
  IfcVector3 *x;
  iterator __end2;
  iterator __begin2;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  undefined1 auStack_188 [8];
  IfcVector2 vmax;
  IfcVector2 vmin;
  undefined1 local_158 [8];
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour_flat;
  IfcFloat coord;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  undefined1 auStack_e8 [8];
  IfcMatrix3 minv;
  undefined1 auStack_98 [8];
  IfcMatrix3 m;
  IfcVector3 nor;
  bool ok;
  bool result;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *out;
  TempMesh *curmesh_local;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors_local;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *openings_local;
  
  LogFunctions<Assimp::IFCImporter>::LogWarn
            ("forced to use poly2tri fallback method to generate wall openings");
  nor.z._7_1_ = 0;
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&m.c3);
  DerivePlaneCoordinateSpace
            ((IfcMatrix3 *)auStack_98,curmesh,(bool *)((long)&nor.z + 6),(IfcVector3 *)&m.c3);
  if ((nor.z._6_1_ & 1) == 0) {
    openings_local._7_1_ = 0;
  }
  else {
    local_f8 = m.c2;
    local_108 = m.b3;
    dStack_100 = m.c1;
    local_118 = m.b1;
    dStack_110 = m.b2;
    local_128 = m.a2;
    dStack_120 = m.a3;
    coord = (IfcFloat)auStack_98;
    dStack_130 = m.a1;
    paVar2 = aiMatrix3x3t<double>::Inverse((aiMatrix3x3t<double> *)&coord);
    minv.c2 = paVar2->c3;
    auStack_e8 = (undefined1  [8])paVar2->a1;
    minv.a1 = paVar2->a2;
    minv.a2 = paVar2->a3;
    minv.a3 = paVar2->b1;
    minv.b1 = paVar2->b2;
    minv.b2 = paVar2->b3;
    minv.b3 = paVar2->c1;
    minv.c1 = paVar2->c2;
    contour_flat.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xbff0000000000000;
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::vector
              ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)local_158);
    sVar3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                      (&curmesh->mVerts);
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::reserve
              ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)local_158,sVar3);
    aiVector2t<double>::aiVector2t((aiVector2t<double> *)&vmax.y);
    aiVector2t<double>::aiVector2t((aiVector2t<double> *)auStack_188);
    MinMaxChooser<aiVector2t<double>_>::operator()
              ((MinMaxChooser<aiVector2t<double>_> *)((long)&__range2 + 7),
               (aiVector2t<double> *)&vmax.y,(aiVector2t<double> *)auStack_188);
    __end2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                       (&curmesh->mVerts);
    x = (IfcVector3 *)
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end(&curmesh->mVerts)
    ;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                  *)&x);
      if (!bVar1) break;
      vv.z = (double)__gnu_cxx::
                     __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                     ::operator*(&__end2);
      ::operator*((aiVector3t<double> *)local_1c8,(aiMatrix3x3t<double> *)auStack_98,
                  (aiVector3t<double> *)vv.z);
      contour_flat.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)vv.y;
      aiVector2t<double>::aiVector2t(&local_1e8,(double)local_1c8,vv.x);
      aVar13 = std::min<double>(&local_1e8,(aiVector2t<double> *)&vmax.y);
      vmin.x = aVar13.y;
      vmax.y = aVar13.x;
      local_1d8 = aVar13;
      aiVector2t<double>::aiVector2t(&local_208,(double)local_1c8,vv.x);
      aVar13 = std::max<double>(&local_208,(aiVector2t<double> *)auStack_188);
      vmax.x = aVar13.y;
      auStack_188 = (undefined1  [8])aVar13.x;
      local_1f8 = aVar13;
      aiVector2t<double>::aiVector2t
                ((aiVector2t<double> *)
                 &clipped.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(double)local_1c8,vv.x);
      std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)local_158,
                 (value_type *)
                 &clipped.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
      ::operator++(&__end2);
    }
    aiVector2t<double>::operator-=((aiVector2t<double> *)auStack_188,(aiVector2t<double> *)&vmax.y);
    dVar11 = aiVector2t<double>::Length((aiVector2t<double> *)auStack_188);
    if ((dVar11 == 0.0) && (!NAN(dVar11))) {
      __assert_fail("vmax.Length()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x5dc,
                    "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                   );
    }
    std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::vector
              ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
               &holes_union.
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              *)&wall_extrusion.z);
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)auStack_260);
    clipper_holes._191_1_ = 1;
    ClipperLib::Clipper::Clipper((Clipper *)&c);
    __range2_1 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
    __end2_1 = std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
               begin(openings);
    t = (TempOpening *)
        std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::end
                  (openings);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
                          *)&t);
      if (!bVar1) break;
      pTVar4 = __gnu_cxx::
               __normal_iterator<const_Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
               ::operator*(&__end2_1);
      v2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                     (nors,(size_type)__range2_1);
      dVar11 = ::operator*((aiVector3t<double> *)&m.c3,v2);
      if (0.9999989867210388 <= ABS(dVar11)) {
        contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&pTVar4->profileMesh);
        sVar3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                          ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                           contour.
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (2 < sVar3) {
          std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::vector
                    ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&__range3);
          this_05 = std::
                    __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&pTVar4->profileMesh);
          __end3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                             (&this_05->mVerts);
          xx = (IfcVector3 *)
               std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                         (&this_05->mVerts);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                        *)&xx);
            if (!bVar1) break;
            pVector = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator*(&__end3);
            ::operator*((aiVector3t<double> *)&vv_extr.z,(aiMatrix3x3t<double> *)auStack_98,pVector)
            ;
            ::operator+((aiVector3t<double> *)local_3e8,pVector,&pTVar4->extrusionDir);
            ::operator*((aiVector3t<double> *)auStack_3d0,(aiMatrix3x3t<double> *)auStack_98,
                        (aiVector3t<double> *)local_3e8);
            local_3e9 = ABS(vv_extr.y -
                            (double)contour_flat.
                                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) <
                        ABS(vv_1.y - (double)contour_flat.
                                             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (((clipper_holes._191_1_ & 1) != 0) && (clipper_holes._191_1_ = 0, 0.0 < dVar11)) {
              _auStack_260 = (pTVar4->extrusionDir).x;
              wall_extrusion.x = (pTVar4->extrusionDir).y;
              wall_extrusion.y = (pTVar4->extrusionDir).z;
              if ((bool)local_3e9) {
                ::operator-(&local_408,(aiVector3t<double> *)auStack_260);
                _auStack_260 = local_408.x;
                wall_extrusion.x = local_408.y;
                wall_extrusion.y = local_408.z;
              }
            }
            if ((local_3e9 & 1) == 0) {
              local_cb8 = &vv_extr.z;
            }
            else {
              local_cb8 = (double *)auStack_3d0;
            }
            vv_1.y = local_cb8[2];
            vv_extr.z = *local_cb8;
            aiVector2t<double>::aiVector2t
                      ((aiVector2t<double> *)
                       &hole.
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,vv_extr.z,local_cb8[1]);
            std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                      ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&__range3
                       ,(value_type *)
                        &hole.
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __gnu_cxx::
            __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
            ::operator++(&__end3);
          }
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                    ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                     &__range3_1);
          __end3_1 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin
                               ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                                &__range3);
          pip = (IfcVector2 *)
                std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::end
                          ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                           &__range3);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end3_1,
                               (__normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                *)&pip);
            if (!bVar1) break;
            local_450 = __gnu_cxx::
                        __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                        ::operator*(&__end3_1);
            local_450->x = (local_450->x - vmax.y) / (double)auStack_188;
            local_450->y = (local_450->y - vmin.x) / vmax.x;
            dVar11 = local_450->x * 1518500249.0;
            uVar10 = (ulong)dVar11;
            dVar12 = local_450->y * 1518500249.0;
            uVar9 = (ulong)dVar12;
            ClipperLib::IntPoint::IntPoint
                      (&local_460,
                       uVar10 | (long)(dVar11 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f,
                       uVar9 | (long)(dVar12 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f);
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       &__range3_1,&local_460);
            __gnu_cxx::
            __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
            ::operator++(&__end3_1);
          }
          bVar1 = ClipperLib::Orientation((Polygon *)&__range3_1);
          if (!bVar1) {
            iVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                *)&__range3_1);
            iVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                *)&__range3_1);
            std::
            reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                      ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                        )iVar5._M_current,
                       (__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                        )iVar6._M_current);
          }
          ClipperLib::ClipperBase::AddPolygon
                    ((ClipperBase *)((long)&c + *(long *)(c - 0x18)),(Polygon *)&__range3_1,
                     ptSubject);
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                    ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                     &__range3_1);
          std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~vector
                    ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&__range3);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
      ::operator++(&__end2_1);
      __range2_1 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
                   ((long)&(__range2_1->
                           super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    ClipperLib::Clipper::Execute
              ((Clipper *)&c,ctUnion,(Polygons *)&wall_extrusion.z,pftNonZero,pftNonZero);
    bVar1 = std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::empty((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                     *)&wall_extrusion.z);
    if (bVar1) {
      openings_local._7_1_ = 0;
      poly.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&__range3_2)
      ;
      __end3_2 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin
                           ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                            local_158);
      pip_1 = (IfcVector2 *)
              std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::end
                        ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                         local_158);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3_2,
                           (__normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                            *)&pip_1);
        if (!bVar1) break;
        local_4b0 = __gnu_cxx::
                    __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                    ::operator*(&__end3_2);
        local_4b0->x = (local_4b0->x - vmax.y) / (double)auStack_188;
        local_4b0->y = (local_4b0->y - vmin.x) / vmax.x;
        dVar11 = local_4b0->x * 1518500249.0;
        uVar10 = (ulong)dVar11;
        dVar12 = local_4b0->y * 1518500249.0;
        uVar9 = (ulong)dVar12;
        ClipperLib::IntPoint::IntPoint
                  (&local_4c0,uVar10 | (long)(dVar11 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f
                   ,uVar9 | (long)(dVar12 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f);
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                  ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                   &__range3_2,&local_4c0);
        __gnu_cxx::
        __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
        ::operator++(&__end3_2);
      }
      bVar1 = ClipperLib::Orientation((Polygon *)&__range3_2);
      if (bVar1) {
        iVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                          ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                           &__range3_2);
        iVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                          ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                           &__range3_2);
        std::
        reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                  ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                    )iVar5._M_current,
                   (__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                    )iVar6._M_current);
      }
      ClipperLib::Clipper::Clear((Clipper *)&c);
      ClipperLib::ClipperBase::AddPolygon
                ((ClipperBase *)((long)&c + *(long *)(c - 0x18)),(Polygon *)&__range3_2,ptSubject);
      ClipperLib::ClipperBase::AddPolygons
                ((ClipperBase *)((long)&c + *(long *)(c - 0x18)),(Polygons *)&wall_extrusion.z,
                 ptClip);
      ClipperLib::Clipper::Execute
                ((Clipper *)&c,ctDifference,
                 (ExPolygons *)
                 &holes_union.
                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pftNonZero,pftNonZero);
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&__range3_2)
      ;
      poly.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    ClipperLib::Clipper::~Clipper((Clipper *)&c);
    if (poly.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                 &old_vertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &contours.
                  super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::swap
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                 &old_vertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&curmesh->mVerts);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &contours.
                  super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&curmesh->mVertcnt);
      std::
      vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ::vector((vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                *)&__range2_2);
      this = &holes_union.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end2_2 = std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::begin
                           ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *
                            )this);
      clip = (ExPolygon *)
             std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::end
                       ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
                        this);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2_2,
                           (__normal_iterator<ClipperLib::ExPolygon_*,_std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>_>
                            *)&clip);
        if (!bVar1) break;
        contour_points.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<ClipperLib::ExPolygon_*,_std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>_>
                      ::operator*(&__end2_2);
        std::
        vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
        ::clear((vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                 *)&__range2_2);
        std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::vector
                  ((vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&__range3_3);
        this_04 = contour_points.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        __end3_3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                             ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *
                              )contour_points.
                               super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        point = (IntPoint *)
                std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                          ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                           this_04);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end3_3,
                             (__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                              *)&point);
          if (!bVar1) break;
          local_758 = __gnu_cxx::
                      __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                      ::operator*(&__end3_3);
          pPVar8 = (Point *)operator_new(0x28);
          p2t::Point::Point(pPVar8,(double)local_758->X / 1518500249.0,
                            (double)local_758->Y / 1518500249.0);
          cdt = (CDT *)pPVar8;
          std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::push_back
                    ((vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&__range3_3,
                     (value_type *)&cdt);
          __gnu_cxx::
          __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
          ::operator++(&__end3_3);
        }
        this_06 = (CDT *)operator_new(0x10);
        p2t::CDT::CDT(this_06,(vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&__range3_3);
        this_07 = (vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   *)(contour_points.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
        __end3_4 = std::
                   vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ::begin(this_07);
        opening = (Polygon *)
                  std::
                  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  ::end(this_07);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end3_4,
                             (__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                              *)&opening);
          if (!bVar1) break;
          local_970 = __gnu_cxx::
                      __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                      ::operator*(&__end3_4);
          contour_1 = (vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)0x0;
          ppPStack_980 = (pointer)0x0;
          local_978 = (pointer)0x0;
          std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::vector
                    ((vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&contour_1);
          std::
          vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
          ::push_back((vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                       *)&__range2_2,
                      (vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&contour_1);
          std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::~vector
                    ((vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&contour_1);
          this_08 = std::
                    vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                    ::back((vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                            *)&__range2_2);
          this_03 = local_970;
          __end4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                             (local_970);
          point_1 = (IntPoint *)
                    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                              (this_03);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end4,(__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                                        *)&point_1);
            if (!bVar1) break;
            local_9b0 = __gnu_cxx::
                        __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                        ::operator*(&__end4);
            pPVar8 = (Point *)operator_new(0x28);
            p2t::Point::Point(pPVar8,(double)local_9b0->X / 1518500249.0,
                              (double)local_9b0->Y / 1518500249.0);
            e_1 = (exception *)pPVar8;
            std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::push_back
                      (this_08,(value_type *)&e_1);
            __gnu_cxx::
            __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
            ::operator++(&__end4);
          }
          p2t::CDT::AddHole(this_06,this_08);
          __gnu_cxx::
          __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
          ::operator++(&__end3_4);
        }
        p2t::CDT::Triangulate(this_06);
        p2t::CDT::GetTriangles
                  ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)&__range3_5,this_06)
        ;
        __end3_5 = std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::begin
                             ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)
                              &__range3_5);
        tri = (Triangle *)
              std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::end
                        ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)&__range3_5);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end3_5,
                             (__normal_iterator<p2t::Triangle_*const_*,_std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>_>
                              *)&tri);
          if (!bVar1) break;
          ppTVar7 = __gnu_cxx::
                    __normal_iterator<p2t::Triangle_*const_*,_std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>_>
                    ::operator*(&__end3_5);
          this_02 = *ppTVar7;
          for (v.y._4_4_ = 0; v.y._4_4_ < 3; v.y._4_4_ = v.y._4_4_ + 1) {
            pPVar8 = p2t::Triangle::GetPoint(this_02,v.y._4_4_);
            dVar11 = pPVar8->x;
            pPVar8 = p2t::Triangle::GetPoint(this_02,v.y._4_4_);
            aiVector2t<double>::aiVector2t((aiVector2t<double> *)&v3.z,dVar11,pPVar8->y);
            bVar1 = false;
            if (((v3.z <= 1.0) && (bVar1 = false, 0.0 <= v3.z)) && (bVar1 = false, v.x <= 1.0)) {
              bVar1 = 0.0 <= v.x;
            }
            if (!bVar1) {
              __assert_fail("v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCOpenings.cpp"
                            ,0x68a,
                            "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                           );
            }
            aiVector3t<double>::aiVector3t
                      (&local_c20,v3.z * (double)auStack_188 + vmax.y,v.x * vmax.x + vmin.x,
                       (double)contour_flat.
                               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::operator*((aiVector3t<double> *)local_c08,(aiMatrix3x3t<double> *)auStack_e8,
                        &local_c20);
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&curmesh->mVerts,(value_type *)local_c08);
          }
          local_c24 = 3;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&curmesh->mVertcnt,&local_c24);
          __gnu_cxx::
          __normal_iterator<p2t::Triangle_*const_*,_std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>_>
          ::operator++(&__end3_5);
        }
        nor.z._7_1_ = 1;
        std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::~vector
                  ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)&__range3_5);
        poly.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::~vector
                  ((vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&__range3_3);
        __gnu_cxx::
        __normal_iterator<ClipperLib::ExPolygon_*,_std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>_>
        ::operator++(&__end2_2);
      }
      if ((nor.z._7_1_ & 1) == 0) {
        local_c38._M_current =
             (aiVector3t<double> *)
             std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                       (&curmesh->mVerts);
        __gnu_cxx::
        __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
        ::__normal_iterator<aiVector3t<double>*>
                  ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                    *)&local_c30,&local_c38);
        this_00 = &old_vertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_c40._M_current =
             (aiVector3t<double> *)
             std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                       ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)this_00)
        ;
        local_c48 = (aiVector3t<double> *)
                    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               this_00);
        local_c50 = (aiVector3t<double> *)
                    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                    insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,void>
                              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                               curmesh,local_c30,local_c40,
                               (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                )local_c48);
        local_c60._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (&curmesh->mVertcnt);
        __gnu_cxx::
        __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
        ::__normal_iterator<unsigned_int*>
                  ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    *)&local_c58,&local_c60);
        this_01 = &contours.
                   super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
        __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&curmesh->mVertcnt,local_c58
                   ,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     )__first._M_current,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__last._M_current);
        LogFunctions<Assimp::IFCImporter>::LogError
                  ("Ifc: revert, could not generate openings for this wall");
      }
      openings_local._7_1_ = nor.z._7_1_ & 1;
      poly.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      std::
      vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ::~vector((vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                 *)&__range2_2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &contours.
                  super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~vector
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                 &old_vertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               *)&wall_extrusion.z);
    std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector
              ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
               &holes_union.
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~vector
              ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)local_158);
  }
  return (bool)(openings_local._7_1_ & 1);
}

Assistant:

bool TryAddOpenings_Poly2Tri(const std::vector<TempOpening>& openings,const std::vector<IfcVector3>& nors,
    TempMesh& curmesh)
{
    IFCImporter::LogWarn("forced to use poly2tri fallback method to generate wall openings");
    std::vector<IfcVector3>& out = curmesh.mVerts;

    bool result = false;

    // Try to derive a solid base plane within the current surface for use as
    // working coordinate system.
    bool ok;
    IfcVector3 nor;
    const IfcMatrix3 m = DerivePlaneCoordinateSpace(curmesh, ok, nor);
    if (!ok) {
        return false;
    }

    const IfcMatrix3 minv = IfcMatrix3(m).Inverse();


    IfcFloat coord = -1;

    std::vector<IfcVector2> contour_flat;
    contour_flat.reserve(out.size());

    IfcVector2 vmin, vmax;
    MinMaxChooser<IfcVector2>()(vmin, vmax);

    // Move all points into the new coordinate system, collecting min/max verts on the way
    for(IfcVector3& x : out) {
        const IfcVector3 vv = m * x;

        // keep Z offset in the plane coordinate system. Ignoring precision issues
        // (which  are present, of course), this should be the same value for
        // all polygon vertices (assuming the polygon is planar).


        // XXX this should be guarded, but we somehow need to pick a suitable
        // epsilon
        // if(coord != -1.0f) {
        //  assert(std::fabs(coord - vv.z) < 1e-3f);
        // }

        coord = vv.z;

        vmin = std::min(IfcVector2(vv.x, vv.y), vmin);
        vmax = std::max(IfcVector2(vv.x, vv.y), vmax);

        contour_flat.push_back(IfcVector2(vv.x,vv.y));
    }

    // With the current code in DerivePlaneCoordinateSpace,
    // vmin,vmax should always be the 0...1 rectangle (+- numeric inaccuracies)
    // but here we won't rely on this.

    vmax -= vmin;

    // If this happens then the projection must have been wrong.
    ai_assert(vmax.Length());

    ClipperLib::ExPolygons clipped;
    ClipperLib::Polygons holes_union;


    IfcVector3 wall_extrusion;
    bool first = true;

    try {

        ClipperLib::Clipper clipper_holes;
        size_t c = 0;

        for(const TempOpening& t :openings) {
            const IfcVector3& outernor = nors[c++];
            const IfcFloat dot = nor * outernor;
            if (std::fabs(dot)<1.f-1e-6f) {
                continue;
            }

            const std::vector<IfcVector3>& va = t.profileMesh->mVerts;
            if(va.size() <= 2) {
                continue;
            }

            std::vector<IfcVector2> contour;

            for(const IfcVector3& xx : t.profileMesh->mVerts) {
                IfcVector3 vv = m *  xx, vv_extr = m * (xx + t.extrusionDir);

                const bool is_extruded_side = std::fabs(vv.z - coord) > std::fabs(vv_extr.z - coord);
                if (first) {
                    first = false;
                    if (dot > 0.f) {
                        wall_extrusion = t.extrusionDir;
                        if (is_extruded_side) {
                            wall_extrusion = - wall_extrusion;
                        }
                    }
                }

                // XXX should not be necessary - but it is. Why? For precision reasons?
                vv = is_extruded_side ? vv_extr : vv;
                contour.push_back(IfcVector2(vv.x,vv.y));
            }

            ClipperLib::Polygon hole;
            for(IfcVector2& pip : contour) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                hole.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
            }

            if (!ClipperLib::Orientation(hole)) {
                std::reverse(hole.begin(), hole.end());
            //  assert(ClipperLib::Orientation(hole));
            }

            /*ClipperLib::Polygons pol_temp(1), pol_temp2(1);
            pol_temp[0] = hole;

            ClipperLib::OffsetPolygons(pol_temp,pol_temp2,5.0);
            hole = pol_temp2[0];*/

            clipper_holes.AddPolygon(hole,ClipperLib::ptSubject);
        }

        clipper_holes.Execute(ClipperLib::ctUnion,holes_union,
            ClipperLib::pftNonZero,
            ClipperLib::pftNonZero);

        if (holes_union.empty()) {
            return false;
        }

        // Now that we have the big union of all holes, subtract it from the outer contour
        // to obtain the final polygon to feed into the triangulator.
        {
            ClipperLib::Polygon poly;
            for(IfcVector2& pip : contour_flat) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                poly.push_back(ClipperLib::IntPoint( to_int64(pip.x), to_int64(pip.y) ));
            }

            if (ClipperLib::Orientation(poly)) {
                std::reverse(poly.begin(), poly.end());
            }
            clipper_holes.Clear();
            clipper_holes.AddPolygon(poly,ClipperLib::ptSubject);

            clipper_holes.AddPolygons(holes_union,ClipperLib::ptClip);
            clipper_holes.Execute(ClipperLib::ctDifference,clipped,
                ClipperLib::pftNonZero,
                ClipperLib::pftNonZero);
        }

    }
    catch (const char* sx) {
        IFCImporter::LogError("Ifc: error during polygon clipping, skipping openings for this face: (Clipper: "
            + std::string(sx) + ")");

        return false;
    }

    std::vector<IfcVector3> old_verts;
    std::vector<unsigned int> old_vertcnt;

    old_verts.swap(curmesh.mVerts);
    old_vertcnt.swap(curmesh.mVertcnt);

    std::vector< std::vector<p2t::Point*> > contours;
    for(ClipperLib::ExPolygon& clip : clipped) {

        contours.clear();

        // Build the outer polygon contour line for feeding into poly2tri
        std::vector<p2t::Point*> contour_points;
        for(ClipperLib::IntPoint& point : clip.outer) {
            contour_points.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
        }

        p2t::CDT* cdt ;
        try {
            // Note: this relies on custom modifications in poly2tri to raise runtime_error's
            // instead if assertions. These failures are not debug only, they can actually
            // happen in production use if the input data is broken. An assertion would be
            // inappropriate.
            cdt = new p2t::CDT(contour_points);
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }


        // Build the poly2tri inner contours for all holes we got from ClipperLib
        for(ClipperLib::Polygon& opening : clip.holes) {

            contours.push_back(std::vector<p2t::Point*>());
            std::vector<p2t::Point*>& contour = contours.back();

            for(ClipperLib::IntPoint& point : opening) {
                contour.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
            }

            cdt->AddHole(contour);
        }

        try {
            // Note: See above
            cdt->Triangulate();
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }

        const std::vector<p2t::Triangle*> tris = cdt->GetTriangles();

        // Collect the triangles we just produced
        for(p2t::Triangle* tri : tris) {
            for(int i = 0; i < 3; ++i) {

                const IfcVector2 v = IfcVector2(
                    static_cast<IfcFloat>( tri->GetPoint(i)->x ),
                    static_cast<IfcFloat>( tri->GetPoint(i)->y )
                );

                ai_assert(v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0);
                const IfcVector3 v3 = minv * IfcVector3(vmin.x + v.x * vmax.x, vmin.y + v.y * vmax.y,coord) ;

                curmesh.mVerts.push_back(v3);
            }
            curmesh.mVertcnt.push_back(3);
        }

        result = true;
    }

    if (!result) {
        // revert -- it's a shame, but better than nothing
        curmesh.mVerts.insert(curmesh.mVerts.end(),old_verts.begin(), old_verts.end());
        curmesh.mVertcnt.insert(curmesh.mVertcnt.end(),old_vertcnt.begin(), old_vertcnt.end());

        IFCImporter::LogError("Ifc: revert, could not generate openings for this wall");
    }

    return result;
}